

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

UINT GetConsoleOutputCP(void)

{
  UINT UVar1;
  UINT nRet;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  UVar1 = GetACP();
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return UVar1;
}

Assistant:

UINT
PALAPI
GetConsoleOutputCP(
       VOID)
{
    UINT nRet = 0;
    PERF_ENTRY(GetConsoleOutputCP);
    ENTRY("GetConsoleOutputCP()\n");
    nRet = GetACP();
    LOGEXIT("GetConsoleOutputCP returns UINT %d \n", nRet );
    PERF_EXIT(GetConsoleOutputCP);
    return nRet;
}